

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.h
# Opt level: O2

bool QTest::qCompare<QModelIndex,QModelIndex>
               (QModelIndex *t1,QModelIndex *t2,char *actual,char *expected,char *file,int line)

{
  bool bVar1;
  
  bVar1 = comparesEqual(t1,t2);
  bVar1 = compare_helper(bVar1,"Compared values are not the same",t1,t2,
                         Internal::genericToString<QModelIndex>,
                         Internal::genericToString<QModelIndex>,actual,expected,file,line);
  return bVar1;
}

Assistant:

inline bool qCompare(const T1 &t1, const T2 &t2, const char *actual, const char *expected,
                         const char *file, int line)
    {
        using Internal::genericToString;
        if constexpr (QtPrivate::is_standard_or_extended_integer_type_v<T1>
                      && QtPrivate::is_standard_or_extended_integer_type_v<T2>) {
            return compare_helper(q20::cmp_equal(t1, t2), "Compared values are not the same",
                                  std::addressof(t1), std::addressof(t2),
                                  genericToString<T1>, genericToString<T2>,
                                  actual, expected, file, line);
        } else {
            return compare_helper(t1 == t2, "Compared values are not the same",
                                  std::addressof(t1), std::addressof(t2),
                                  genericToString<T1>, genericToString<T2>,
                                  actual, expected, file, line);
        }
    }